

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGeneratorFactory.h
# Opt level: O2

void __thiscall
cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3>::GetGenerators
          (cmGlobalGeneratorSimpleFactory<cmGlobalUnixMakefileGenerator3> *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *names)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  cmGlobalUnixMakefileGenerator3::GetActualName_abi_cxx11_();
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)names,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

virtual void GetGenerators(std::vector<std::string>& names) const {
    names.push_back(T::GetActualName()); }